

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O0

int archive_compressor_zstd_options(archive_write_filter *f,char *key,char *value)

{
  int iVar1;
  uint uVar2;
  ZSTD_bounds ZVar3;
  size_t sStack_70;
  int max_distance;
  ZSTD_bounds bounds;
  intmax_t long_distance;
  intmax_t max_frame_size;
  intmax_t min_frame_size;
  intmax_t threads;
  int maximum;
  int minimum;
  intmax_t level;
  private_data_conflict8 *data;
  char *value_local;
  char *key_local;
  archive_write_filter *f_local;
  
  level = (intmax_t)f->data;
  data = (private_data_conflict8 *)value;
  value_local = key;
  key_local = (char *)f;
  iVar1 = strcmp(key,"compression-level");
  if (iVar1 == 0) {
    iVar1 = string_to_number((char *)data,(intmax_t *)&maximum);
    if (iVar1 == 0) {
      threads._4_4_ = -99;
      threads._0_4_ = 0x16;
      threads._0_4_ = ZSTD_maxCLevel();
      uVar2 = ZSTD_versionNumber();
      if (uVar2 < 0x2842) {
        uVar2 = ZSTD_versionNumber();
        if (uVar2 < 0x2840) {
          threads._4_4_ = 0;
        }
      }
      else {
        threads._4_4_ = ZSTD_minCLevel();
      }
      if ((_maximum < threads._4_4_) || ((int)threads < _maximum)) {
        f_local._4_4_ = -0x14;
      }
      else {
        *(int *)level = (int)_maximum;
        f_local._4_4_ = 0;
      }
    }
    else {
      f_local._4_4_ = -0x14;
    }
  }
  else {
    iVar1 = strcmp(value_local,"threads");
    if (iVar1 == 0) {
      iVar1 = string_to_number((char *)data,&min_frame_size);
      if (iVar1 == 0) {
        if (min_frame_size < 0) {
          f_local._4_4_ = -0x14;
        }
        else {
          *(int *)(level + 4) = (int)min_frame_size;
          f_local._4_4_ = 0;
        }
      }
      else {
        f_local._4_4_ = -0x14;
      }
    }
    else {
      iVar1 = strcmp(value_local,"frame-per-file");
      if (iVar1 == 0) {
        *(undefined4 *)(level + 0x10) = 1;
        f_local._4_4_ = 0;
      }
      else {
        iVar1 = strcmp(value_local,"min-frame-size");
        if (iVar1 == 0) {
          iVar1 = string_to_number((char *)data,&max_frame_size);
          if (iVar1 == 0) {
            if (max_frame_size < 0) {
              f_local._4_4_ = -0x14;
            }
            else {
              *(intmax_t *)(level + 0x18) = max_frame_size;
              f_local._4_4_ = 0;
            }
          }
          else {
            f_local._4_4_ = -0x14;
          }
        }
        else {
          iVar1 = strcmp(value_local,"max-frame-size");
          if (iVar1 == 0) {
            iVar1 = string_to_number((char *)data,&long_distance);
            if (iVar1 == 0) {
              if (long_distance < 0x400) {
                f_local._4_4_ = -0x14;
              }
              else {
                *(intmax_t *)(level + 0x20) = long_distance;
                f_local._4_4_ = 0;
              }
            }
            else {
              f_local._4_4_ = -0x14;
            }
          }
          else {
            iVar1 = strcmp(value_local,"long");
            if (iVar1 == 0) {
              iVar1 = string_to_number((char *)data,(intmax_t *)&bounds.lowerBound);
              if (iVar1 == 0) {
                ZVar3 = ZSTD_cParam_getBounds(ZSTD_c_windowLog);
                sStack_70 = ZVar3.error;
                uVar2 = ZSTD_isError(sStack_70);
                if (uVar2 == 0) {
                  bounds.error._0_4_ = ZVar3.lowerBound;
                  if ((bounds.lowerBound < (int)bounds.error) ||
                     (bounds.error._4_4_ = ZVar3.upperBound, bounds.error._4_4_ < bounds.lowerBound)
                     ) {
                    return -0x14;
                  }
                }
                else if ((bounds.lowerBound < 10) || (0x1f < bounds.lowerBound)) {
                  return -0x14;
                }
                *(int *)(level + 8) = bounds.lowerBound;
                f_local._4_4_ = 0;
              }
              else {
                f_local._4_4_ = -0x14;
              }
            }
            else {
              f_local._4_4_ = -0x14;
            }
          }
        }
      }
    }
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_compressor_zstd_options(struct archive_write_filter *f, const char *key,
    const char *value)
{
	struct private_data *data = (struct private_data *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		intmax_t level;
		if (string_to_number(value, &level) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
		/* If we don't have the library, hard-code the max level */
		int minimum = CLEVEL_MIN;
		int maximum = CLEVEL_MAX;
#if HAVE_ZSTD_H && HAVE_LIBZSTD_COMPRESSOR
		maximum = ZSTD_maxCLevel();
#if ZSTD_VERSION_NUMBER >= MINVER_MINCLEVEL
		if (ZSTD_versionNumber() >= MINVER_MINCLEVEL) {
			minimum = ZSTD_minCLevel();
		}
		else
#endif
		if (ZSTD_versionNumber() < MINVER_NEGCLEVEL) {
			minimum = CLEVEL_STD_MIN;
		}
#endif
		if (level < minimum || level > maximum) {
			return (ARCHIVE_WARN);
		}
		data->compression_level = (int)level;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "threads") == 0) {
		intmax_t threads;
		if (string_to_number(value, &threads) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
		if (threads < 0) {
			return (ARCHIVE_WARN);
		}
		data->threads = (int)threads;
		return (ARCHIVE_OK);
#if HAVE_ZSTD_H && HAVE_LIBZSTD_COMPRESSOR
	} else if (strcmp(key, "frame-per-file") == 0) {
		data->frame_per_file = 1;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "min-frame-size") == 0) {
		intmax_t min_frame_size;
		if (string_to_number(value, &min_frame_size) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
		if (min_frame_size < 0) {
			return (ARCHIVE_WARN);
		}
		data->min_frame_size = min_frame_size;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "max-frame-size") == 0) {
		intmax_t max_frame_size;
		if (string_to_number(value, &max_frame_size) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
		if (max_frame_size < 1024) {
			return (ARCHIVE_WARN);
		}
		data->max_frame_size = max_frame_size;
		return (ARCHIVE_OK);
#endif
	}
	else if (strcmp(key, "long") == 0) {
		intmax_t long_distance;
		if (string_to_number(value, &long_distance) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
#if HAVE_ZSTD_H && HAVE_LIBZSTD_COMPRESSOR && ZSTD_VERSION_NUMBER >= MINVER_LONG
		ZSTD_bounds bounds = ZSTD_cParam_getBounds(ZSTD_c_windowLog);
		if (ZSTD_isError(bounds.error)) {
			int max_distance = ((int)(sizeof(size_t) == 4 ? 30 : 31));
			if (((int)long_distance) < 10 || (int)long_distance > max_distance)
				return (ARCHIVE_WARN);
		} else {
			if ((int)long_distance < bounds.lowerBound || (int)long_distance > bounds.upperBound)
				return (ARCHIVE_WARN);
		}
#else
		int max_distance = ((int)(sizeof(size_t) == 4 ? 30 : 31));
		if (((int)long_distance) < 10 || (int)long_distance > max_distance)
		    return (ARCHIVE_WARN);
#endif
		data->long_distance = (int)long_distance;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}